

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O3

void __thiscall DnsStats::SubmitCborPacket(DnsStats *this,cdns *cdns_ctx,size_t packet_id)

{
  int iVar1;
  int iVar2;
  pointer pcVar3;
  pointer pcVar4;
  int64_t iVar5;
  bool bVar6;
  uint uVar7;
  byte bVar8;
  cdns_query_signature *q_sig;
  long lVar9;
  cdns_query *query;
  
  pcVar3 = (cdns_ctx->block).queries.super__Vector_base<cdns_query,_std::allocator<cdns_query>_>.
           _M_impl.super__Vector_impl_data._M_start;
  iVar1 = cdns_ctx->index_offset;
  if (pcVar3[packet_id].query_signature_index < iVar1) {
    q_sig = (cdns_query_signature *)0x0;
  }
  else {
    q_sig = (cdns_ctx->block).tables.q_sigs.
            super__Vector_base<cdns_query_signature,_std::allocator<cdns_query_signature>_>._M_impl.
            super__Vector_impl_data._M_start +
            ((long)pcVar3[packet_id].query_signature_index - (long)iVar1);
  }
  iVar2 = pcVar3[packet_id].client_address_index;
  query = pcVar3 + packet_id;
  if (this->t_start_usec == 0 && this->t_start_sec == 0) {
    iVar5 = (cdns_ctx->block).preamble.earliest_time_usec;
    this->t_start_sec = (int)(cdns_ctx->block).preamble.earliest_time_sec;
    this->t_start_usec = (int)iVar5;
  }
  lVar9 = (long)iVar2 - (long)iVar1;
  this->volume_53only = (long)query->response_size + (long)query->query_size + this->volume_53only;
  if ((this->rootAddresses).table.tableCount == 0) {
    AddressFilter::SetList(&this->rootAddresses,DefaultRootAddresses,0x1c);
  }
  pcVar4 = (cdns_ctx->block).tables.addresses.
           super__Vector_base<cbor_bytes,_std::allocator<cbor_bytes>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar6 = CheckAddress(this,pcVar4[lVar9].v,pcVar4[lVar9].l);
  if ((cdns_ctx->preamble_parsed == true) && ((cdns_ctx->preamble).cdns_version_major == 0)) {
    if (q_sig == (cdns_query_signature *)0x0) {
      return;
    }
    bVar8 = (byte)q_sig->qr_transport_flags ^ 1;
  }
  else {
    if (q_sig == (cdns_query_signature *)0x0) {
      return;
    }
    bVar8 = (q_sig->qr_transport_flags & 0x1e) == 0;
  }
  if ((bVar6) && (((bVar8 & 1) != 0 || ((this->dnsstat_flags & 0x40) != 0)))) {
    uVar7 = q_sig->qr_sig_flags;
    if ((uVar7 & 1) != 0) {
      this->query_count = this->query_count + 1;
      SubmitCborPacketQuery(this,cdns_ctx,query,q_sig);
      uVar7 = q_sig->qr_sig_flags;
    }
    if ((uVar7 & 0x32) != 0) {
      this->response_count = this->response_count + 1;
      SubmitCborPacketResponse(this,cdns_ctx,query,q_sig);
      return;
    }
  }
  return;
}

Assistant:

void DnsStats::SubmitCborPacket(cdns* cdns_ctx, size_t packet_id)
{
    bool unfiltered = false;
    cdns_query* query = &cdns_ctx->block.queries[packet_id];
    cdns_query_signature* q_sig = NULL; 
    size_t c_address_id = (size_t)query->client_address_index - cdns_ctx->index_offset;
    bool is_udp;

    if (query->query_signature_index >= cdns_ctx->index_offset) {
        q_sig = &cdns_ctx->block.tables.q_sigs[(size_t)query->query_signature_index - cdns_ctx->index_offset];
    }

    if (t_start_sec == 0 && t_start_usec == 0) {
        t_start_sec = (uint32_t)cdns_ctx->block.preamble.earliest_time_sec;
        t_start_usec = (uint32_t)cdns_ctx->block.preamble.earliest_time_usec;
    }

    volume_53only += query->query_size;
    volume_53only += query->response_size;

    if (rootAddresses.GetCount() == 0)
    {
        rootAddresses.SetList(DefaultRootAddresses, sizeof(DefaultRootAddresses) / sizeof(char const*));
    }

    unfiltered = CheckAddress(cdns_ctx->block.tables.addresses[c_address_id].v,
        cdns_ctx->block.tables.addresses[c_address_id].l);

    if (cdns_ctx->is_old_version()) {
        is_udp = (q_sig == NULL) || (q_sig->qr_transport_flags & 1) == 0;
    }
    else {
        is_udp = (q_sig == NULL) || ((q_sig->qr_transport_flags >> 1)&0xF) == 0;
    }

    if (unfiltered && q_sig != NULL &&
        ( is_udp || (dnsstat_flags& dnsStateFlagIncludeTcpRecords) != 0))
    {
        /* Some QSIG flags bits vary between RFC and draft, but bit 0 and bit 5 have the same meaning. */
        if ((q_sig->qr_sig_flags&0x01) != 0)
        {
            query_count++;

            SubmitCborPacketQuery(cdns_ctx, query, q_sig);
        }

        if ((q_sig->qr_sig_flags & 0x32) != 0)
        {
            response_count++;

            SubmitCborPacketResponse(cdns_ctx, query, q_sig);
        }
    }
}